

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::getLowerUnscaled(SPxLPBase<double> *this,VectorBase<double> *vec)

{
  vector<double,_std::allocator<double>_> local_28;
  
  if (this->_isScaled == true) {
    (*this->lp_scaler->_vptr_SPxScaler[0x17])(this->lp_scaler,this,vec);
    return;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_28,&(this->super_LPColSetBase<double>).low.val);
  std::vector<double,_std::allocator<double>_>::operator=(&vec->val,&local_28);
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxLPBase<R>::getLowerUnscaled(VectorBase<R>& vec) const
{
   if(_isScaled)
      lp_scaler->getLowerUnscaled(*this, vec);
   else
      vec = VectorBase<R>(LPColSetBase<R>::lower());
}